

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geodesic.cpp
# Opt level: O1

string * __thiscall Geodesic::toString_abi_cxx11_(string *__return_storage_ptr__,Geodesic *this)

{
  ostream *poVar1;
  double dVar2;
  ostringstream ss;
  string local_1d0;
  RatioSequence local_1b0;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  dVar2 = getDist(this);
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"; ",2);
  RatioSequence::getNonDesRSWithMinDist(&local_1b0,&this->rs);
  RatioSequence::toString_abi_cxx11_(&local_1d0,&local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  std::vector<Ratio,_std::allocator<Ratio>_>::~vector(&local_1b0._RatioSequence);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

string Geodesic::toString() {
    ostringstream ss;
    ss << getDist() << "; " << rs.getNonDesRSWithMinDist().toString();
    return ss.str();
}